

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set_column.h
# Opt level: O1

bool Gudhi::persistence_matrix::operator==
               (Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_false>_>_>
                *c1,Unordered_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_false>_>_>
                    *c2)

{
  __node_base_ptr p_Var1;
  _Hash_node_base *p_Var2;
  __node_base *p_Var3;
  bool bVar4;
  Entry *entry;
  key_type local_30;
  
  if (c1 == c2) {
    bVar4 = true;
  }
  else if ((c1->column_)._M_h._M_element_count == (c2->column_)._M_h._M_element_count) {
    p_Var3 = &(c1->column_)._M_h._M_before_begin;
    while( true ) {
      p_Var3 = p_Var3->_M_nxt;
      bVar4 = p_Var3 == (__node_base *)0x0;
      if (bVar4) break;
      local_30 = *(key_type *)(p_Var3 + 1);
      p_Var1 = std::
               _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_false>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_false>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::_M_find_before_node
                         (&(c2->column_)._M_h,
                          (ulong)*(uint *)&((_Hash_node_base *)((long)local_30 + 8))->_M_nxt %
                          (c2->column_)._M_h._M_bucket_count,&local_30,
                          (ulong)*(uint *)&((_Hash_node_base *)((long)local_30 + 8))->_M_nxt);
      p_Var2 = (_Hash_node_base *)0x0;
      if (p_Var1 != (__node_base_ptr)0x0) {
        p_Var2 = p_Var1->_M_nxt;
      }
      if (p_Var2 == (_Hash_node_base *)0x0) {
        return bVar4;
      }
      if (*(uint *)((long)&(p_Var2[1]._M_nxt)->_M_nxt + 4) !=
          (local_30->super_Entry_field_element_option).element_) {
        return bVar4;
      }
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool operator==(const Unordered_set_column& c1, const Unordered_set_column& c2) {
    if (&c1 == &c2) return true;
    if (c1.column_.size() != c2.column_.size()) return false;

    for (Entry* entry : c1.column_) {
      auto it = c2.column_.find(entry);
      if (it == c2.column_.end()) return false;
      if constexpr (!Master_matrix::Option_list::is_z2)
        if ((*it)->get_element() != entry->get_element()) return false;
    }
    return true;
  }